

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc_length_parameterized_bezier.cpp
# Opt level: O1

int main(void)

{
  void *pvVar1;
  double dVar2;
  double dVar3;
  Matrix<double,_2,_1,_0,_2,_1> *p;
  Matrix<double,_2,_1,_0,_2,_1> *pMVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  PointType ps4;
  double t;
  double step;
  PointType ps4_1;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> vec;
  Mat img;
  Bezier<3,_2> bezier;
  initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_278;
  Matrix<double,_2,_1,_0,_2,_1> local_268;
  double local_250;
  _InputArray local_248;
  double local_230;
  _InputArray local_228;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  void *local_1e8;
  undefined8 uStack_1e0;
  long local_1d8;
  int local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  Matrix<double,_2,_1,_0,_2,_1> local_1b8;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  Bezier<3,_2> local_158;
  
  local_278._M_array = &local_1b8;
  local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       100.0;
  local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       200.0;
  local_1a8 = 0x4079000000000000;
  local_1a0 = 0x4059000000000000;
  local_198 = 0x4074000000000000;
  local_190 = 0x4072c00000000000;
  local_188 = 0x4082c00000000000;
  local_180 = 0x4079000000000000;
  local_278._M_len = 4;
  Bezier<3,_2>::Bezier(&local_158,&local_278);
  local_268.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_268.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_278._M_array = (iterator)0x0;
  local_278._M_len = 0;
  cv::Mat::Mat((Mat *)&local_1b8,500,700,0x10,(Scalar_ *)&local_278);
  local_228.obj = &local_1e8;
  local_1d8 = 0;
  local_1e8 = (void *)0x0;
  uStack_1e0 = 0;
  local_250 = 0.0;
  local_230 = 0.01;
  do {
    local_248.flags = 0;
    local_228.flags = 4;
    Curve<3,_2>::atWithArcLengthParameterized
              ((Curve<3,_2> *)&local_278,(double *)&local_158,(int *)&local_250,&local_248.flags,
               (double *)&local_228);
    local_248.flags = (int)(double)local_278._M_array;
    local_228.flags = (int)(double)local_278._M_len;
    std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<int,int>
              ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)local_228.obj,
               &local_248.flags,&local_228.flags);
    local_250 = local_230 + local_250;
  } while (local_250 <= 1.0);
  local_248.sz.width = 0;
  local_248.sz.height = 0;
  local_248.flags = 0x3010000;
  local_248.obj = &local_1b8;
  local_228.sz.width = 0;
  local_228.sz.height = 0;
  local_228.flags = -0x7efcfff4;
  local_278._M_array = (iterator)0x0;
  local_278._M_len = 0;
  local_268.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       255.0;
  local_268.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       0.0;
  cv::polylines((_InputOutputArray *)&local_248,&local_228,false,(Scalar_ *)&local_278,1,0x10,0);
  local_250 = 0.0;
  local_230 = 0.25;
  iVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  do {
    local_278._M_array = (iterator)((ulong)local_278._M_array & 0xffffffff00000000);
    local_248.flags = 4;
    local_1c8 = iVar5;
    uStack_1c4 = uVar6;
    uStack_1c0 = uVar7;
    uStack_1bc = uVar8;
    Curve<3,_2>::atWithArcLengthParameterized
              ((Curve<3,_2> *)&local_228,(double *)&local_158,(int *)&local_250,(int *)&local_278,
               (double *)&local_248);
    local_1f0 = (int)(double)CONCAT44(local_228._4_4_,local_228.flags);
    local_248.sz.width = 0;
    local_248.sz.height = 0;
    local_1ec = (int)(double)local_228.obj;
    local_248.flags = 0x3010000;
    local_248.obj = &local_1b8;
    local_278._M_array = (iterator)0x0;
    local_278._M_len = 0x406fe00000000000;
    local_268.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_268.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
         = 0.0;
    cv::circle(&local_248,&local_1f0,4,&local_278,0xffffffff,8,0);
    dVar2 = (double)CONCAT44(uStack_1c4,local_1c8);
    dVar3 = (double)CONCAT44(uStack_1bc,uStack_1c0);
    if ((((dVar2 != 0.0) || (NAN(dVar2))) || (dVar3 != 0.0)) || (NAN(dVar3))) {
      local_248.sz.width = 0;
      local_248.sz.height = 0;
      local_248.flags = 0x3010000;
      local_248.obj = &local_1b8;
      local_1f8 = (int)dVar2;
      local_1f4 = (int)dVar3;
      local_200 = (int)(double)CONCAT44(local_228._4_4_,local_228.flags);
      local_1fc = (int)(double)local_228.obj;
      local_278._M_array = (iterator)0x406fe00000000000;
      local_278._M_len = 0x406fe00000000000;
      local_268.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0] = 255.0;
      local_268.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1] = 0.0;
      cv::line(&local_248,&local_1f8,&local_200,&local_278,1,0x10,0);
    }
    local_250 = local_230 + local_250;
    iVar5 = local_228.flags;
    uVar6 = local_228._4_4_;
    uVar7 = local_228.obj._0_4_;
    uVar8 = local_228.obj._4_4_;
  } while (local_250 <= 1.0);
  local_278._M_array = (iterator)CONCAT44(local_278._M_array._4_4_,4);
  Curve<3,_2>::sampleWithArcLengthParameterized
            ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&local_248,&local_158.super_Curve<3,_2>,&local_230,false,(int *)&local_278,
             (vector<double,_std::allocator<double>_> *)0x0);
  pvVar1 = local_248.obj;
  pMVar4 = (Matrix<double,_2,_1,_0,_2,_1> *)CONCAT44(local_248._4_4_,local_248.flags);
  if (pMVar4 != (Matrix<double,_2,_1,_0,_2,_1> *)local_248.obj) {
    do {
      local_228.sz.width = 0;
      local_228.sz.height = 0;
      local_228.flags = 0x3010000;
      local_228.obj = &local_1b8;
      local_208 = (int)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                       m_storage.m_data.array[0];
      local_204 = (int)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                       m_storage.m_data.array[1];
      local_278._M_array = (iterator)0x406fe00000000000;
      local_278._M_len = 0;
      local_268.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0] = 0.0;
      local_268.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [1] = 0.0;
      cv::circle(&local_228,&local_208,2,&local_278,0xffffffff,8,0);
      pMVar4 = pMVar4 + 1;
    } while (pMVar4 != (Matrix<double,_2,_1,_0,_2,_1> *)pvVar1);
  }
  pvVar1 = (void *)CONCAT44(local_248._4_4_,local_248.flags);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_248.sz - (long)pvVar1);
  }
  local_278._M_array = &local_268;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,"arc-length parameterized of bezier curve","");
  local_248.sz.width = 0;
  local_248.sz.height = 0;
  local_248.flags = 0x1010000;
  local_248.obj = &local_1b8;
  cv::imshow((string *)&local_278,&local_248);
  if (local_278._M_array != &local_268) {
    operator_delete(local_278._M_array,
                    (long)local_268.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                          m_storage.m_data.array[0] + 1);
  }
  cv::waitKey(0);
  if (local_1e8 != (void *)0x0) {
    operator_delete(local_1e8,local_1d8 - (long)local_1e8);
  }
  cv::Mat::~Mat((Mat *)&local_1b8);
  return 0;
}

Assistant:

int main() {
  // define a bezier
  Bezier bezier{{100, 200}, {400, 100}, {320, 300}, {600, 400}};

  Mat img(500, 700, CV_8UC3, Scalar(0));

  Eigen::Vector2d prev_point{0, 0};
  vector<Point> vec;

  // draw curve
  double t = 0.0, step = 0.01;
  while (t <= 1.0) {
    auto ps4 = bezier.atWithArcLengthParameterized(t, 0, 4);
    vec.emplace_back(int(ps4[0]), int(ps4[1]));
    t += step;
  }
  polylines(img, vec, false, {0, 0, 255}, 1, LINE_AA);

  // draw equal arc distance point
  t = 0, step = 0.25;
  while (t <= 1.0) {
    auto ps4 = bezier.atWithArcLengthParameterized(t, 0, 4);
    circle(img, {int(ps4[0]), int(ps4[1])}, 4, {0, 255, 0}, -1);
    if (prev_point != Eigen::Vector2d::Zero()) {
      line(img,
           {int(prev_point[0]), int(prev_point[1])},
           {int(ps4[0]), int(ps4[1])},
           {255, 255, 255},
           1,
           LINE_AA);
    }
    prev_point = ps4;
    t += step;
  }

  for (auto& p : bezier.sampleWithArcLengthParameterized(step, false, 4)) {
    circle(img, {int(p[0]), int(p[1])}, 2, {255, 0, 0}, -1);
  }

  imshow("arc-length parameterized of bezier curve", img);
  waitKey(0);

  return 0;
}